

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::EnumDescriptorProto::MergeFrom
          (EnumDescriptorProto *this,EnumDescriptorProto *from)

{
  uint uVar1;
  void *pvVar2;
  Rep *pRVar3;
  string *initial_value;
  string *psVar4;
  void **ppvVar5;
  EnumOptions *pEVar6;
  int iVar7;
  Arena *pAVar8;
  
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  iVar7 = (from->value_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar7 != 0) {
    pRVar3 = (from->value_).super_RepeatedPtrFieldBase.rep_;
    ppvVar5 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->value_).super_RepeatedPtrFieldBase,iVar7);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
              (&(this->value_).super_RepeatedPtrFieldBase,ppvVar5,pRVar3->elements,iVar7,
               ((this->value_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->value_).super_RepeatedPtrFieldBase.current_size_);
    iVar7 = iVar7 + (this->value_).super_RepeatedPtrFieldBase.current_size_;
    (this->value_).super_RepeatedPtrFieldBase.current_size_ = iVar7;
    pRVar3 = (this->value_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3->allocated_size < iVar7) {
      pRVar3->allocated_size = iVar7;
    }
  }
  iVar7 = (from->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar7 != 0) {
    pRVar3 = (from->reserved_range_).super_RepeatedPtrFieldBase.rep_;
    ppvVar5 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->reserved_range_).super_RepeatedPtrFieldBase,iVar7);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange>::TypeHandler>
              (&(this->reserved_range_).super_RepeatedPtrFieldBase,ppvVar5,pRVar3->elements,iVar7,
               ((this->reserved_range_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_);
    iVar7 = iVar7 + (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
    (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar7;
    pRVar3 = (this->reserved_range_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3->allocated_size < iVar7) {
      pRVar3->allocated_size = iVar7;
    }
  }
  iVar7 = (from->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar7 != 0) {
    pRVar3 = (from->reserved_name_).super_RepeatedPtrFieldBase.rep_;
    ppvVar5 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->reserved_name_).super_RepeatedPtrFieldBase,iVar7);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
              (&(this->reserved_name_).super_RepeatedPtrFieldBase,ppvVar5,pRVar3->elements,iVar7,
               ((this->reserved_name_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_);
    iVar7 = iVar7 + (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
    (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = iVar7;
    pRVar3 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3->allocated_size < iVar7) {
      pRVar3->allocated_size = iVar7;
    }
  }
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      initial_value = (from->name_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 1;
      pAVar8 = (Arena *)(this->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar8 & 1) != 0) {
        pAVar8 = *(Arena **)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x18);
      }
      psVar4 = (this->name_).ptr_;
      if (psVar4 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&this->name_,pAVar8,initial_value);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar4);
      }
    }
    if ((uVar1 & 2) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      if (this->options_ == (EnumOptions *)0x0) {
        pAVar8 = (Arena *)(this->_internal_metadata_).
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          .ptr_;
        if (((ulong)pAVar8 & 1) != 0) {
          pAVar8 = *(Arena **)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x18);
        }
        pEVar6 = Arena::CreateMaybeMessage<google::protobuf::EnumOptions>(pAVar8);
        this->options_ = pEVar6;
      }
      pEVar6 = (EnumOptions *)_EnumOptions_default_instance_;
      if (from->options_ != (EnumOptions *)0x0) {
        pEVar6 = from->options_;
      }
      EnumOptions::MergeFrom(this->options_,pEVar6);
      return;
    }
  }
  return;
}

Assistant:

void EnumDescriptorProto::MergeFrom(const EnumDescriptorProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.EnumDescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  value_.MergeFrom(from.value_);
  reserved_range_.MergeFrom(from.reserved_range_);
  reserved_name_.MergeFrom(from.reserved_name_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_name(from._internal_name());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_mutable_options()->PROTOBUF_NAMESPACE_ID::EnumOptions::MergeFrom(from._internal_options());
    }
  }
}